

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManPrintUniqueVars(Aig_VSig_t *pMints,int nVars)

{
  int __c;
  uint __c_00;
  Aig_VSig_t *pAVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  pAVar1 = pMints;
  if (0 < nVars) {
    uVar3 = (ulong)(uint)nVars;
  }
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    __c = 0x3d;
    if (pAVar1->nOnes != pAVar1[1].nOnes) {
      __c = 0x78;
    }
    putchar(__c);
    pAVar1 = pAVar1 + 2;
  }
  putchar(10);
  putchar(0x30);
  pAVar1 = pMints + 2;
  lVar2 = 0;
  for (uVar3 = 1; (long)uVar3 < (long)nVars; uVar3 = uVar3 + 1) {
    __c_00 = 0x2d;
    if (pMints[lVar2 >> 0x20].nOnes != pAVar1->nOnes) {
      if (uVar3 < 10) {
        __c_00 = (uint)uVar3 | 0x30;
      }
      else {
        __c_00 = (uint)uVar3 + 0x37;
      }
    }
    putchar(__c_00);
    pAVar1 = pAVar1 + 2;
    lVar2 = lVar2 + 0x200000000;
  }
  putchar(10);
  return;
}

Assistant:

void Aig_RManPrintUniqueVars( Aig_VSig_t * pMints, int nVars )
{
    int i;
    for ( i = 0; i < nVars; i++ )
        if ( Aig_RManCompareSigs( &pMints[2*i], &pMints[2*i+1], nVars ) == 0 )
            printf( "=" );
        else 
            printf( "x" );
    printf( "\n" );

    printf( "0" );
    for ( i = 1; i < nVars; i++ )
        if ( Aig_RManCompareSigs( &pMints[2*(i-1)], &pMints[2*i], nVars ) == 0 )
            printf( "-" );
        else if ( i < 10 )
            printf( "%c", '0' + i );
        else 
            printf( "%c", 'A' + i-10 );
    printf( "\n" );
}